

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O2

adjusted_mantissa __thiscall
fast_float::negative_digit_comp<double>
          (fast_float *this,bigint *bigmant,adjusted_mantissa am,int32_t exponent)

{
  fast_float *this_00;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int32_t shift;
  fast_float *this_01;
  int iVar7;
  uint uVar8;
  bool bVar9;
  adjusted_mantissa aVar10;
  anon_class_4_1_ba1d6a41 local_24c;
  fast_float *local_248;
  bigint *local_240;
  adjusted_mantissa local_238;
  bigint theor_digits;
  
  iVar2 = am.power2;
  iVar4 = (int)am.mantissa;
  if (iVar4 < -10) {
    iVar5 = 1 - iVar4;
    iVar7 = 0;
    if (iVar5 < 0x40) {
      iVar7 = iVar5;
    }
    uVar1 = 0;
    if (iVar5 < 0x40) {
      uVar1 = (ulong)bigmant >> ((byte)iVar7 & 0x3f);
    }
    uVar3 = (ulong)(0xfffffffffffff < uVar1);
  }
  else {
    uVar3 = 0x7ff;
    uVar1 = 0;
    if (iVar4 < 0x7f4) {
      uVar3 = (ulong)(iVar4 + 0xb);
      uVar1 = (ulong)bigmant >> 0xb & 0xfffffffffffff;
    }
  }
  uVar3 = (uVar3 << 0x34 | uVar1) & 0x7ff0000000000000;
  if (uVar3 == 0) {
    uVar1 = uVar1 & 0xfffffffffffff;
    iVar7 = -0x433;
  }
  else {
    uVar1 = (uVar1 & 0xfffffffffffff) + 0x10000000000000;
    iVar7 = (uint)(uVar3 >> 0x34) - 0x434;
  }
  this_01 = (fast_float *)&theor_digits;
  local_248 = this;
  local_240 = bigmant;
  bigint::bigint((bigint *)this_01,uVar1 * 2 + 1);
  uVar8 = iVar7 - iVar2;
  if (iVar2 != 0) {
    bigint::pow5(&theor_digits,-iVar2);
  }
  this_00 = local_248;
  if ((int)uVar8 < 1) {
    if (-1 < (int)uVar8) goto LAB_002c9f0b;
    uVar8 = -uVar8;
    this_01 = local_248;
  }
  bigint::shl((bigint *)this_01,(ulong)uVar8);
LAB_002c9f0b:
  local_24c.ord = bigint::compare((bigint *)this_00,&theor_digits);
  local_238.mantissa = (uint64_t)local_240;
  local_238.power2 = iVar4;
  if (iVar4 < -10) {
    shift = 0x40;
    if (1 - iVar4 < 0x40) {
      shift = 1 - iVar4;
    }
    negative_digit_comp<double>::anon_class_4_1_ba1d6a41::operator()(&local_24c,&local_238,shift);
    uVar1 = (ulong)((bigint *)0xfffffffffffff < local_238.mantissa);
  }
  else {
    negative_digit_comp<double>::anon_class_4_1_ba1d6a41::operator()(&local_24c,&local_238,0xb);
    bVar9 = local_238.mantissa >> 0x35 != 0;
    local_238.mantissa = (uint64_t)(local_238.mantissa & 0xfffffffffffff);
    if (bVar9) {
      local_238.mantissa = (uint64_t)(bigint *)0x0;
    }
    uVar6 = (uint)bVar9 + local_238.power2;
    uVar8 = uVar6;
    if (0x7fe < (int)uVar6) {
      uVar8 = 0x7ff;
    }
    uVar1 = (ulong)uVar8;
    if (0x7fe < (int)uVar6) {
      local_238.mantissa = (uint64_t)(bigint *)0x0;
    }
  }
  aVar10._8_8_ = uVar1;
  aVar10.mantissa = local_238.mantissa;
  return aVar10;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa negative_digit_comp(bigint& bigmant, adjusted_mantissa am, int32_t exponent) noexcept {
  bigint& real_digits = bigmant;
  int32_t real_exp = exponent;

  // get the value of `b`, rounded down, and get a bigint representation of b+h
  adjusted_mantissa am_b = am;
  // gcc7 buf: use a lambda to remove the noexcept qualifier bug with -Wnoexcept-type.
  round<T>(am_b, [](adjusted_mantissa&a, int32_t shift) { round_down(a, shift); });
  T b;
  to_float(false, am_b, b);
  adjusted_mantissa theor = to_extended_halfway(b);
  bigint theor_digits(theor.mantissa);
  int32_t theor_exp = theor.power2;

  // scale real digits and theor digits to be same power.
  int32_t pow2_exp = theor_exp - real_exp;
  uint32_t pow5_exp = uint32_t(-real_exp);
  if (pow5_exp != 0) {
    FASTFLOAT_ASSERT(theor_digits.pow5(pow5_exp));
  }
  if (pow2_exp > 0) {
    FASTFLOAT_ASSERT(theor_digits.pow2(uint32_t(pow2_exp)));
  } else if (pow2_exp < 0) {
    FASTFLOAT_ASSERT(real_digits.pow2(uint32_t(-pow2_exp)));
  }

  // compare digits, and use it to director rounding
  int ord = real_digits.compare(theor_digits);
  adjusted_mantissa answer = am;
  round<T>(answer, [ord](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [ord](bool is_odd, bool _, bool __) -> bool {
      (void)_;  // not needed, since we've done our comparison
      (void)__; // not needed, since we've done our comparison
      if (ord > 0) {
        return true;
      } else if (ord < 0) {
        return false;
      } else {
        return is_odd;
      }
    });
  });

  return answer;
}